

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

int IsValidExtendedFormat(WebPDemuxer *dmux)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  bool bVar3;
  bool bVar4;
  ChunkData *alpha;
  ChunkData *image;
  int frame_count;
  int cur_frame_set;
  Frame *f;
  int is_animation;
  Frame *local_20;
  int local_4;
  
  bVar3 = (*(uint *)(in_RDI + 0x30) & 2) != 0;
  local_20 = *(Frame **)(in_RDI + 0x48);
  if (*(int *)(in_RDI + 0x28) == 0) {
    local_4 = 1;
  }
  else if ((*(int *)(in_RDI + 0x34) < 1) || (*(int *)(in_RDI + 0x38) < 1)) {
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x3c) < 0) {
    local_4 = 0;
  }
  else if ((*(int *)(in_RDI + 0x28) == 2) && (*(long *)(in_RDI + 0x48) == 0)) {
    local_4 = 0;
  }
  else if ((*(uint *)(in_RDI + 0x30) & 0xffffffc1) == 0) {
    while (local_20 != (Frame *)0x0) {
      iVar1 = local_20->frame_num_;
      while( true ) {
        bVar4 = false;
        if (local_20 != (Frame *)0x0) {
          bVar4 = local_20->frame_num_ == iVar1;
        }
        if (!bVar4) break;
        if ((!bVar3) && (1 < local_20->frame_num_)) {
          return 0;
        }
        if (local_20->complete_ == 0) {
          if (*(int *)(in_RDI + 0x28) == 2) {
            return 0;
          }
          if (((local_20->img_components_[1].size_ != 0) &&
              (local_20->img_components_[0].size_ != 0)) &&
             (local_20->img_components_[0].offset_ < local_20->img_components_[1].offset_)) {
            return 0;
          }
          if (local_20->next_ != (Frame *)0x0) {
            return 0;
          }
        }
        else {
          if ((local_20->img_components_[1].size_ == 0) && (local_20->img_components_[0].size_ == 0)
             ) {
            return 0;
          }
          if ((local_20->img_components_[1].size_ != 0) &&
             (local_20->img_components_[0].offset_ < local_20->img_components_[1].offset_)) {
            return 0;
          }
          if ((local_20->width_ < 1) || (local_20->height_ < 1)) {
            return 0;
          }
        }
        if (((0 < local_20->width_) && (0 < local_20->height_)) &&
           (iVar2 = CheckFrameBounds(local_20,(uint)((bVar3 ^ 0xffU) & 1),*(int *)(in_RDI + 0x34),
                                     *(int *)(in_RDI + 0x38)), iVar2 == 0)) {
          return 0;
        }
        local_20 = local_20->next_;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int IsValidExtendedFormat(const WebPDemuxer* const dmux) {
  const int is_animation = !!(dmux->feature_flags_ & ANIMATION_FLAG);
  const Frame* f = dmux->frames_;

  if (dmux->state_ == WEBP_DEMUX_PARSING_HEADER) return 1;

  if (dmux->canvas_width_ <= 0 || dmux->canvas_height_ <= 0) return 0;
  if (dmux->loop_count_ < 0) return 0;
  if (dmux->state_ == WEBP_DEMUX_DONE && dmux->frames_ == NULL) return 0;
  if (dmux->feature_flags_ & ~ALL_VALID_FLAGS) return 0;  // invalid bitstream

  while (f != NULL) {
    const int cur_frame_set = f->frame_num_;
    int frame_count = 0;

    // Check frame properties.
    for (; f != NULL && f->frame_num_ == cur_frame_set; f = f->next_) {
      const ChunkData* const image = f->img_components_;
      const ChunkData* const alpha = f->img_components_ + 1;

      if (!is_animation && f->frame_num_ > 1) return 0;

      if (f->complete_) {
        if (alpha->size_ == 0 && image->size_ == 0) return 0;
        // Ensure alpha precedes image bitstream.
        if (alpha->size_ > 0 && alpha->offset_ > image->offset_) {
          return 0;
        }

        if (f->width_ <= 0 || f->height_ <= 0) return 0;
      } else {
        // There shouldn't be a partial frame in a complete file.
        if (dmux->state_ == WEBP_DEMUX_DONE) return 0;

        // Ensure alpha precedes image bitstream.
        if (alpha->size_ > 0 && image->size_ > 0 &&
            alpha->offset_ > image->offset_) {
          return 0;
        }
        // There shouldn't be any frames after an incomplete one.
        if (f->next_ != NULL) return 0;
      }

      if (f->width_ > 0 && f->height_ > 0 &&
          !CheckFrameBounds(f, !is_animation,
                            dmux->canvas_width_, dmux->canvas_height_)) {
        return 0;
      }

      ++frame_count;
    }
  }
  return 1;
}